

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seriot_suite.cpp
# Opt level: O1

void i_number_suite::i_number_huge_exp(void)

{
  size_t sVar1;
  char *this;
  unkbyte10 in_ST0;
  reader reader;
  char input [136];
  view_type local_218;
  longdouble local_208;
  basic_reader<char> local_1f0;
  char local_a8 [144];
  
  memcpy(local_a8,
         "0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006"
         ,0x88);
  sVar1 = strlen(local_a8);
  local_218._M_len._0_4_ = (value)sVar1;
  local_218._M_len._4_4_ = (undefined4)(sVar1 >> 0x20);
  local_218._M_str._0_2_ = SUB82(local_a8,0);
  local_218._M_str._2_6_ = (undefined6)((ulong)local_a8 >> 0x10);
  trial::protocol::json::basic_reader<char>::basic_reader(&local_1f0,&local_218);
  local_218._M_len._0_4_ = local_1f0.decoder.current.code;
  local_208 = (longdouble)CONCAT64(local_208._4_6_,9);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::real",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x2d,"void i_number_suite::i_number_huge_exp()",&local_218,&local_208);
  local_218._M_len =
       (long)local_1f0.decoder.current.view.tail - (long)local_1f0.decoder.current.view.head;
  local_218._M_str._0_2_ = SUB82(local_1f0.decoder.current.view.head,0);
  local_218._M_str._2_6_ = (undefined6)((ulong)local_1f0.decoder.current.view.head >> 0x10);
  this = 
  "\"0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006\""
  ;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[136]>
            ("reader.literal()",
             "\"0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006\""
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x2e,"void i_number_suite::i_number_huge_exp()",&local_218,
             "0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006"
            );
  trial::protocol::json::basic_reader<char>::value<long_double>
            ((longdouble *)&local_1f0,(basic_reader<char> *)this);
  local_218._M_len._0_4_ = (value)in_ST0;
  local_218._M_len._4_4_ = (undefined4)((unkuint10)in_ST0 >> 0x20);
  local_218._M_str._0_2_ = (undefined2)((unkuint10)in_ST0 >> 0x40);
  local_208 = (longdouble)INFINITY;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_double,long_double>
            ("reader.value<long double>()","std::numeric_limits<long double>::infinity()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/seriot_suite.cpp"
             ,0x30,"void i_number_suite::i_number_huge_exp()",&local_218,&local_208);
  if (local_1f0.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f0.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1f0.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f0.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void i_number_huge_exp()
{
    const char input[] = "0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::real);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "0.4e00669999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999999969999999006");
    // Cannot be represented by long double
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<long double>(), std::numeric_limits<long double>::infinity());
}